

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

int map_remove(map *m,int idx,void *ptr)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = -1;
  if ((-1 < idx) && (idx <= (int)m->len)) {
    LOCK();
    bVar2 = ptr == (void *)m->data[(uint)idx];
    if (bVar2) {
      m->data[(uint)idx] = 0;
    }
    UNLOCK();
    iVar1 = bVar2 - 1;
  }
  return iVar1;
}

Assistant:

int
map_remove(struct map *m, int idx, void *ptr)
{
    if (unlikely(idx < 0 || idx > (int)m->len))
           return (-1);

    if (atomic_ptr_cas(&(m->data[idx]), ptr, NULL)) {
        dbg_printf("idx=%i - removed ptr=%p from map", idx, (void *)ptr);
        return (0);
    } else {
        dbg_printf("idx=%i - removal failed, ptr=%p != cur_ptr=%p", idx, ptr, (void *)m->data[idx]);
        return (-1);
    }
}